

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseLocator_test.cpp
# Opt level: O0

void __thiscall test::external_definition::test_method(external_definition *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  int iVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  lazy_ostream *plVar4;
  reference pvVar5;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  basic_cstring<const_char> local_1560;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]> local_1550;
  assertion_result local_1530;
  basic_cstring<const_char> local_1518;
  basic_cstring<const_char> local_1508;
  undefined1 local_14f8 [8];
  string licenseRealContent;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[32],_const_char_(&)[32]> local_14c8;
  allocator local_14a1;
  string local_14a0 [32];
  assertion_result local_1480;
  basic_cstring<const_char> local_1468;
  basic_cstring<const_char> local_1458;
  undefined1 local_1448 [8];
  string currentLocation;
  undefined4 local_141c;
  basic_cstring<const_char> local_1418;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1408;
  basic_cstring<const_char> local_13e0;
  basic_cstring<const_char> local_13d0;
  basic_cstring<const_char> local_13c0;
  basic_cstring<const_char> local_13b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_13a0;
  assertion_result local_1380;
  basic_cstring<const_char> local_1368;
  basic_cstring<const_char> local_1358;
  undefined1 local_1348 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenseInfos;
  ExternalDefinition externalDefinition;
  undefined1 local_12ec [8];
  LicenseLocation licLocation;
  EventRegistry registry;
  undefined1 local_290 [12];
  undefined1 local_280 [12];
  string local_270 [8];
  string referenceContent;
  ifstream src;
  allocator local_31;
  string local_30 [8];
  string applicationDefinedString;
  external_definition *this_local;
  
  applicationDefinedString.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/test_reader.ini;/this/one/doesnt/exist"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::ifstream::ifstream
            ((void *)((long)&referenceContent.field_2 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/test_reader.ini"
             ,_S_bin);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_280,
             (istream_type *)(referenceContent.field_2._M_local_buf + 8));
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_290);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_280._0_8_;
  __beg._M_c = local_280._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_290._0_8_;
  __end._M_c = local_290._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            (local_270,__beg,__end,(allocator<char> *)&registry.field_0x4f);
  std::allocator<char>::~allocator((allocator<char> *)&registry.field_0x4f);
  license::EventRegistry::EventRegistry((EventRegistry *)(licLocation.licenseData + 0xff8));
  memset(local_12ec,0,0x1004);
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  std::copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char*>
            (__first,__last,local_12ec + 4);
  license::locate::ExternalDefinition::ExternalDefinition
            ((ExternalDefinition *)
             &licenseInfos.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(LicenseLocation *)local_12ec);
  license::locate::ExternalDefinition::license_locations_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1348,
             (ExternalDefinition *)
             &licenseInfos.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (EventRegistry *)(licLocation.licenseData + 0xff8));
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1358,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1368);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1358,0x66,&local_1368);
    bVar2 = license::EventRegistry::isGood((EventRegistry *)(licLocation.licenseData + 0xff8));
    boost::test_tools::assertion_result::assertion_result(&local_1380,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_13b0,"registry.isGood()",0x11);
    boost::unit_test::operator<<(&local_13a0,plVar4,&local_13b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_13c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    boost::test_tools::tt_detail::report_assertion(&local_1380,&local_13a0,&local_13c0,0x66,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_13a0);
    boost::test_tools::assertion_result::~assertion_result(&local_1380);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_13d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_13e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_13d0,0x67,&local_13e0);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1408,plVar4,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1418,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    local_141c = 1;
    currentLocation.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1348);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
              (&local_1408,&local_1418,0x67,1,2,&local_141c,"1",
               (undefined1 *)((long)&currentLocation.field_2 + 8),"licenseInfos.size()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1348,0);
  std::__cxx11::string::string((string *)local_1448,(string *)pvVar5);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1458,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1468);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1458,0x69,&local_1468);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_14a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/test_reader.ini"
               ,&local_14a1);
    iVar3 = std::__cxx11::string::compare(local_14a0);
    boost::test_tools::assertion_result::assertion_result(&local_1480,iVar3 == 0);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              (&local_14c8,plVar4,(char (*) [32])"file found at expected location");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)((long)&licenseRealContent.field_2 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    boost::test_tools::tt_detail::report_assertion
              (&local_1480,&local_14c8,(undefined1 *)((long)&licenseRealContent.field_2 + 8),0x69,1,
               1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[32],_const_char_(&)[32]>::
    ~lazy_ostream_impl(&local_14c8);
    boost::test_tools::assertion_result::~assertion_result(&local_1480);
    std::__cxx11::string::~string(local_14a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_14a1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  license::locate::ExternalDefinition::retrieve_license_content
            ((string *)local_14f8,
             (ExternalDefinition *)
             &licenseInfos.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_1448);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1508,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1518);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1508,0x6b,&local_1518);
    iVar3 = std::__cxx11::string::compare(local_270);
    boost::test_tools::assertion_result::assertion_result(&local_1530,iVar3 == 0);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1550,plVar4,(char (*) [21])"File content is same");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1560,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseLocator_test.cpp"
               ,0x7d);
    boost::test_tools::tt_detail::report_assertion(&local_1530,&local_1550,&local_1560,0x6b,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>::
    ~lazy_ostream_impl(&local_1550);
    boost::test_tools::assertion_result::~assertion_result(&local_1530);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string((string *)local_14f8);
  std::__cxx11::string::~string((string *)local_1448);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1348);
  license::locate::ExternalDefinition::~ExternalDefinition
            ((ExternalDefinition *)
             &licenseInfos.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  license::EventRegistry::~EventRegistry((EventRegistry *)(licLocation.licenseData + 0xff8));
  std::__cxx11::string::~string(local_270);
  std::ifstream::~ifstream((void *)((long)&referenceContent.field_2 + 8));
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(external_definition) {
	// an application can define multiple license locations separated by ';'
	string applicationDefinedString = MOCK_LICENSE ";/this/one/doesnt/exist";

	// read test license
	std::ifstream src(MOCK_LICENSE, std::ios::binary);
	std::string referenceContent((std::istreambuf_iterator<char>(src)), std::istreambuf_iterator<char>());
	license::EventRegistry registry;
	LicenseLocation licLocation = {LICENSE_PATH};
	std::copy(applicationDefinedString.begin(), applicationDefinedString.end(), licLocation.licenseData);
	ExternalDefinition externalDefinition(&licLocation);
	vector<string> licenseInfos = externalDefinition.license_locations(registry);
	BOOST_CHECK(registry.isGood());
	BOOST_CHECK_EQUAL(1, licenseInfos.size());
	string currentLocation = licenseInfos[0];
	BOOST_CHECK_MESSAGE(string(MOCK_LICENSE).compare(currentLocation) == 0, "file found at expected location");
	string licenseRealContent = externalDefinition.retrieve_license_content(currentLocation);
	BOOST_CHECK_MESSAGE(referenceContent.compare(licenseRealContent) == 0, "File content is same");
}